

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O0

WebPMuxError WebPMuxSetCanvasSize(WebPMux *mux,int width,int height)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  WebPMuxError err;
  WebPMux *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = WEBP_MUX_INVALID_ARGUMENT;
  }
  else if ((((in_ESI < 0) || (in_EDX < 0)) || (0x1000000 < in_ESI)) || (0x1000000 < in_EDX)) {
    local_4 = WEBP_MUX_INVALID_ARGUMENT;
  }
  else if ((ulong)((long)in_ESI * (long)in_EDX) < 0x100000000) {
    if ((in_ESI * in_EDX == 0) && (in_ESI != 0 || in_EDX != 0)) {
      local_4 = WEBP_MUX_INVALID_ARGUMENT;
    }
    else {
      local_4 = MuxDeleteAllNamedData(in_stack_ffffffffffffffd8,0);
      if ((local_4 == WEBP_MUX_OK) || (local_4 == WEBP_MUX_NOT_FOUND)) {
        *(int *)(in_RDI + 0x38) = in_ESI;
        *(int *)(in_RDI + 0x3c) = in_EDX;
        local_4 = WEBP_MUX_OK;
      }
    }
  }
  else {
    local_4 = WEBP_MUX_INVALID_ARGUMENT;
  }
  return local_4;
}

Assistant:

WebPMuxError WebPMuxSetCanvasSize(WebPMux* mux,
                                  int width, int height) {
  WebPMuxError err;
  if (mux == NULL) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  if (width < 0 || height < 0 ||
      width > MAX_CANVAS_SIZE || height > MAX_CANVAS_SIZE) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  if (width * (uint64_t)height >= MAX_IMAGE_AREA) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  if ((width * height) == 0 && (width | height) != 0) {
    // one of width / height is zero, but not both -> invalid!
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  // If we already assembled a VP8X chunk, invalidate it.
  err = MuxDeleteAllNamedData(mux, kChunks[IDX_VP8X].tag);
  if (err != WEBP_MUX_OK && err != WEBP_MUX_NOT_FOUND) return err;

  mux->canvas_width_ = width;
  mux->canvas_height_ = height;
  return WEBP_MUX_OK;
}